

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::resolveFont(QWidgetPrivate *this)

{
  QFont *in_RDI;
  long in_FS_OFFSET;
  QFont resolvedFont;
  QFont naturalFont;
  QWidgetPrivate *this_00;
  QWidgetPrivate *this_01;
  QFont local_38 [4];
  uint in_stack_ffffffffffffffcc;
  QWidgetPrivate *in_stack_ffffffffffffffd0;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QWidgetPrivate *)&local_18;
  naturalWidgetFont(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  localFont(this_01);
  this_00 = (QWidgetPrivate *)&local_28;
  QFont::resolve((QFont *)this_00);
  QFont::~QFont(local_38);
  setFont_helper(this_00,in_RDI);
  QFont::~QFont((QFont *)this_00);
  QFont::~QFont((QFont *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::resolveFont()
{
    QFont naturalFont = naturalWidgetFont(inheritedFontResolveMask);
    QFont resolvedFont = localFont().resolve(naturalFont);
    setFont_helper(resolvedFont);
}